

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O2

void __thiscall
CTestGen9Resource_Test1DLinearResourceMips_Test::TestBody
          (CTestGen9Resource_Test1DLinearResourceMips_Test *this)

{
  GMM_RESOURCE_INFO *ResourceInfo;
  CTestGen9Resource_Test1DLinearResourceMips_Test *this_00;
  GMM_RESOURCE_FORMAT GVar1;
  uint32_t uVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  uint uVar6;
  undefined8 uStack_148;
  GMM_RESCREATE_PARAMS gmmParams;
  unsigned_long local_98;
  uint auStack_90 [10];
  GMM_RESOURCE_INFO *local_68;
  CTestGen9Resource_Test1DLinearResourceMips_Test *local_60;
  uint local_58;
  TEST_BPP local_54;
  uint32_t StartOfMip;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  internal local_40 [8];
  AssertionResult gtest_ar;
  
  gmmParams.pExistingSysMem = 0;
  gmmParams.Flags.Info = (anon_struct_8_44_94931171_for_Info)0x0;
  gmmParams.MaxLod = 0;
  gmmParams.ArraySize = 0;
  gmmParams.MaximumRenamingListLength = 0;
  gmmParams.NoGfxMemory = '\0';
  gmmParams._109_3_ = 0;
  gmmParams.pPreallocatedResInfo = (GMM_RESOURCE_INFO *)0x0;
  gmmParams.BaseAlignment = 0;
  gmmParams.OverridePitch = 0;
  gmmParams.RotateInfo = 0;
  gmmParams._84_4_ = 0;
  gmmParams.CpTag = 0;
  gmmParams._44_4_ = 0;
  gmmParams.field_6.BaseWidth64 = 0;
  gmmParams.Flags.Wa = (anon_struct_4_14_9f1eeba6_for_Wa)0x0;
  gmmParams.MSAA.SamplePattern = GMM_MSAA_DISABLED;
  gmmParams.MSAA.NumSamples = 0;
  gmmParams.Usage = GMM_RESOURCE_USAGE_UNKNOWN;
  uStack_148 = 1;
  gmmParams.ExistingSysMemSize = 0x100000000;
  gmmParams.Flags.Gpu = (anon_struct_8_45_9b07292e_for_Gpu)0x80000;
  gmmParams.Type = RESOURCE_INVALID;
  gmmParams.Format = GMM_FORMAT_A4P4_UNORM_PALETTE1;
  gmmParams.BaseHeight = 5;
  gmmParams.Depth = 0;
  local_60 = this;
  for (local_54 = TEST_BPP_8; local_54 != TEST_BPP_MAX; local_54 = local_54 + TEST_BPP_16) {
    GVar1 = CTestResource::SetResourceFormat((CTestResource *)local_60,local_54);
    uStack_148 = CONCAT44(GVar1,(undefined4)uStack_148);
    gmmParams.CpTag = 0x100;
    gmmParams._44_4_ = 0;
    gmmParams.field_6.BaseWidth = 1;
    local_68 = (GMM_RESOURCE_INFO *)
               (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                         (CommonULT::pGmmULTClientContext,&uStack_148);
    this_00 = local_60;
    uVar6 = gmmParams.CpTag + 0x3f & 0xffffffc0;
    for (uVar3 = 1; gmmParams.BaseHeight + 1 != uVar3; uVar3 = uVar3 + 1) {
      uVar6 = ((int)((ulong)gmmParams._40_8_ >> ((byte)uVar3 & 0x3f)) + 0x3fU & 0xffffffc0) + uVar6;
    }
    uVar2 = CTestResource::GetBppValue((CTestResource *)local_60,local_54);
    ResourceInfo = local_68;
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)this_00,local_68,0x40);
    CTestResource::VerifyResourceSize<true>
              ((CTestResource *)this_00,ResourceInfo,(ulong)(uVar6 * uVar2 + 0xfff & 0xfffff000));
    auStack_90[6] = 0;
    auStack_90[7] = 0;
    auStack_90[8] = 0;
    auStack_90[9] = 0;
    auStack_90[2] = 0;
    auStack_90[3] = 0;
    auStack_90[4] = 0;
    auStack_90[5] = 0;
    local_98 = 0;
    auStack_90[0] = 0;
    auStack_90[1] = 0;
    gmmParams.MultiTileArch._0_1_ = 1;
    gmmParams.MultiTileArch.GpuVaMappingSet = '\0';
    gmmParams.MultiTileArch.LocalMemEligibilitySet = '\0';
    gmmParams.MultiTileArch.LocalMemPreferredSet = '\0';
    gmmParams.MultiTileArch.Reserved = 0;
    (**(code **)(*(long *)ResourceInfo + 0x68))(ResourceInfo,&gmmParams.MultiTileArch);
    local_48.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              (local_40,"0","OffsetInfo.Render.Offset64",(int *)&local_48,&local_98);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&StartOfMip,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0xdc,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&StartOfMip,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&StartOfMip);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_48);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    local_48.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_40,"0","OffsetInfo.Render.XOffset",(int *)&local_48,auStack_90);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&StartOfMip,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0xdd,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&StartOfMip,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&StartOfMip);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_48);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    local_48.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_40,"0","OffsetInfo.Render.YOffset",(int *)&local_48,auStack_90 + 1);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&StartOfMip,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0xde,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&StartOfMip,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&StartOfMip);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_48);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    local_48.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_40,"0","OffsetInfo.Render.ZOffset",(int *)&local_48,auStack_90 + 2);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&StartOfMip,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0xdf,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&StartOfMip,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&StartOfMip);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_48);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    local_58 = 0;
    for (uVar3 = 1; uVar3 <= (gmmParams._56_8_ & 0xffffffff); uVar3 = uVar3 + 1) {
      auStack_90[6] = 0;
      auStack_90[7] = 0;
      auStack_90[8] = 0;
      auStack_90[9] = 0;
      auStack_90[2] = 0;
      auStack_90[3] = 0;
      auStack_90[4] = 0;
      auStack_90[5] = 0;
      local_98 = 0;
      auStack_90[0] = 0;
      auStack_90[1] = 0;
      gmmParams.MultiTileArch._0_1_ = 1;
      gmmParams.MultiTileArch.GpuVaMappingSet = '\0';
      gmmParams.MultiTileArch.LocalMemEligibilitySet = '\0';
      gmmParams.MultiTileArch.LocalMemPreferredSet = '\0';
      gmmParams.MultiTileArch.Reserved = 0;
      (**(code **)(*(long *)local_68 + 0x68))(local_68,&gmmParams.MultiTileArch);
      uVar4 = (ulong)gmmParams._40_8_ >> ((char)uVar3 - 1U & 0x3f);
      uVar2 = CTestResource::GetBppValue((CTestResource *)local_60,local_54);
      local_58 = local_58 + ((int)uVar4 + 0x3fU & 0xffffffc0) * uVar2;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                (local_40,"StartOfMip","OffsetInfo.Render.Offset64",&local_58,&local_98);
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        pcVar5 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar5 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&StartOfMip,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xea,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&StartOfMip,(Message *)&local_48)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&StartOfMip);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_48);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
      local_48.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_40,"0","OffsetInfo.Render.XOffset",(int *)&local_48,auStack_90);
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        pcVar5 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar5 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&StartOfMip,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xeb,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&StartOfMip,(Message *)&local_48)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&StartOfMip);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_48);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
      local_48.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_40,"0","OffsetInfo.Render.YOffset",(int *)&local_48,auStack_90 + 1);
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        pcVar5 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar5 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&StartOfMip,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xec,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&StartOfMip,(Message *)&local_48)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&StartOfMip);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_48);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
      local_48.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_40,"0","OffsetInfo.Render.ZOffset",(int *)&local_48,auStack_90 + 2);
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        pcVar5 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar5 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&StartOfMip,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xed,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&StartOfMip,(Message *)&local_48)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&StartOfMip);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_48);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
    }
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,local_68);
  }
  return;
}

Assistant:

TEST_F(CTestGen9Resource, Test1DLinearResourceMips)
{
    // Horizontal pixel alignment
    const uint32_t HAlign = 64;

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_1D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.Linear    = 1;
    gmmParams.Flags.Gpu.Texture    = 1;
    gmmParams.MaxLod               = 5;

    // Allocate 256x1 surface
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x100;
        gmmParams.BaseHeight  = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        uint32_t AlignedWidth = GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign);
        for(int mip = 1; mip <= gmmParams.MaxLod; mip++)
        {
            // Since 1D doesn't have a height, mips are just based on width
            AlignedWidth += GMM_ULT_ALIGN(gmmParams.BaseWidth64 >> mip, HAlign);
        }
        uint32_t PitchInBytes = AlignedWidth * GetBppValue(bpp);
        uint32_t AlignedSize  = GMM_ULT_ALIGN(PitchInBytes, PAGE_SIZE);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<false>(ResourceInfo, 0);       // N/A for 1D
        VerifyResourcePitch<false>(ResourceInfo, 0);        // N/A for 1D
        VerifyResourcePitchInTiles<false>(ResourceInfo, 0); // N/A for linear
        VerifyResourceSize<true>(ResourceInfo, AlignedSize);
        VerifyResourceQPitch<false>(ResourceInfo, 0); // N/A for non-arrayed

        // Mip0 should be at offset 0. X/Y/Z Offset should be 0 for linear.
        GMM_REQ_OFFSET_INFO OffsetInfo = {};
        OffsetInfo.ReqRender           = 1;
        OffsetInfo.MipLevel            = 0; //Mip 0
        ResourceInfo->GetOffset(OffsetInfo);
        EXPECT_EQ(0, OffsetInfo.Render.Offset64);
        EXPECT_EQ(0, OffsetInfo.Render.XOffset);
        EXPECT_EQ(0, OffsetInfo.Render.YOffset);
        EXPECT_EQ(0, OffsetInfo.Render.ZOffset);

        // All mips should be right after one another linearly
        uint32_t StartOfMip = 0;
        for(int mip = 1; mip <= gmmParams.MaxLod; mip++)
        {
            OffsetInfo           = {};
            OffsetInfo.ReqRender = 1;
            OffsetInfo.MipLevel  = mip;
            ResourceInfo->GetOffset(OffsetInfo);
            StartOfMip += GMM_ULT_ALIGN(gmmParams.BaseWidth64 >> (mip - 1), HAlign) * GetBppValue(bpp);
            EXPECT_EQ(StartOfMip, OffsetInfo.Render.Offset64);
            EXPECT_EQ(0, OffsetInfo.Render.XOffset);
            EXPECT_EQ(0, OffsetInfo.Render.YOffset);
            EXPECT_EQ(0, OffsetInfo.Render.ZOffset);
        }

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}